

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O1

bool __thiscall
BamTools::Internal::BamReaderPrivate::GetNextAlignmentCore
          (BamReaderPrivate *this,BamAlignment *alignment)

{
  BamRandomAccessController *this_00;
  bool bVar1;
  RegionState RVar2;
  string message;
  string streamError;
  
  bVar1 = BgzfStream::IsOpen(&this->m_stream);
  if (bVar1) {
    this_00 = &this->m_randomAccessController;
    bVar1 = BamRandomAccessController::HasRegion(this_00);
    if (((!bVar1) || (bVar1 = BamRandomAccessController::RegionHasAlignments(this_00), bVar1)) &&
       (bVar1 = LoadNextAlignment(this,alignment), bVar1)) {
      RVar2 = BamRandomAccessController::AlignmentState(this_00,alignment);
      while (RVar2 != AfterRegion) {
        if (RVar2 == OverlapsRegion) {
          (alignment->SupportData).HasCoreOnly = true;
          return true;
        }
        bVar1 = LoadNextAlignment(this,alignment);
        if (!bVar1) {
          return false;
        }
        RVar2 = BamRandomAccessController::AlignmentState(this_00,alignment);
      }
    }
  }
  return false;
}

Assistant:

bool BamReaderPrivate::GetNextAlignmentCore(BamAlignment& alignment)
{

    // skip if stream not opened
    if (!m_stream.IsOpen()) return false;

    try {

        // skip if region is set but has no alignments
        if (m_randomAccessController.HasRegion() &&
            !m_randomAccessController.RegionHasAlignments()) {
            return false;
        }

        // if can't read next alignment
        if (!LoadNextAlignment(alignment)) return false;

        // check alignment's region-overlap state
        BamRandomAccessController::RegionState state =
            m_randomAccessController.AlignmentState(alignment);

        // if alignment starts after region, no need to keep reading
        if (state == BamRandomAccessController::AfterRegion) return false;

        // read until overlap is found
        while (state != BamRandomAccessController::OverlapsRegion) {

            // if can't read next alignment
            if (!LoadNextAlignment(alignment)) return false;

            // check alignment's region-overlap state
            state = m_randomAccessController.AlignmentState(alignment);

            // if alignment starts after region, no need to keep reading
            if (state == BamRandomAccessController::AfterRegion) return false;
        }

        // if we get here, we found the next 'valid' alignment
        // (e.g. overlaps current region if one was set, simply the next alignment if not)
        alignment.SupportData.HasCoreOnly = true;
        return true;

    } catch (BamException& e) {
        const std::string streamError = e.what();
        const std::string message =
            std::string("encountered error reading BAM alignment: \n\t") + streamError;
        SetErrorString("BamReader::GetNextAlignmentCore", message);
        return false;
    }
}